

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O1

int __thiscall wabt::string_view::compare(string_view *this,string_view s)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong __n;
  
  uVar4 = s.size_;
  uVar1 = this->size_;
  __n = uVar4;
  if (uVar1 < uVar4) {
    __n = uVar1;
  }
  uVar3 = 0;
  if (__n != 0) {
    uVar3 = memcmp(this->data_,s.data_,__n);
  }
  uVar2 = -(uint)(uVar1 < uVar4) | 1;
  if (uVar3 != 0) {
    uVar2 = uVar3;
  }
  if (uVar1 == uVar4) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

int string_view::compare(string_view s) const noexcept {
  size_type rlen = std::min(size_, s.size_);
  int result = traits_type::compare(data_, s.data_, rlen);
  if (result != 0 || size_ == s.size_) {
    return result;
  }
  return size_ < s.size_ ? -1 : 1;
}